

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_mktime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *pcVar2;
  jx9_value *pjVar3;
  tm *__tp;
  time_t tVar4;
  int iVar5;
  time_t t;
  time_t local_30;
  
  pcVar2 = (pCtx->pFunc->sName).zString;
  time(&local_30);
  if (*pcVar2 == 'g') {
    __tp = gmtime(&local_30);
  }
  else {
    __tp = localtime(&local_30);
  }
  if (0 < nArg) {
    pjVar3 = *apArg;
    jx9MemObjToInteger(pjVar3);
    __tp->tm_hour = *(int *)&pjVar3->x;
    if (nArg != 1) {
      pjVar3 = apArg[1];
      jx9MemObjToInteger(pjVar3);
      __tp->tm_min = *(int *)&pjVar3->x;
      if (2 < (uint)nArg) {
        pjVar3 = apArg[2];
        jx9MemObjToInteger(pjVar3);
        __tp->tm_sec = *(int *)&pjVar3->x;
        if (nArg != 3) {
          pjVar3 = apArg[3];
          jx9MemObjToInteger(pjVar3);
          __tp->tm_mon = *(int *)&pjVar3->x + -1;
          if (4 < (uint)nArg) {
            pjVar3 = apArg[4];
            jx9MemObjToInteger(pjVar3);
            __tp->tm_mday = *(int *)&pjVar3->x;
            if (nArg != 5) {
              pjVar3 = apArg[5];
              jx9MemObjToInteger(pjVar3);
              iVar1 = *(int *)&pjVar3->x;
              iVar5 = iVar1 + -0x76c;
              if (iVar1 < 0x76d) {
                iVar5 = iVar1;
              }
              __tp->tm_year = iVar5;
              if (6 < (uint)nArg) {
                pjVar3 = apArg[6];
                jx9MemObjToBool(pjVar3);
                __tp->tm_isdst = *(int *)&pjVar3->x;
              }
            }
          }
        }
      }
    }
  }
  tVar4 = mktime(__tp);
  pjVar3 = pCtx->pRet;
  jx9MemObjRelease(pjVar3);
  (pjVar3->x).iVal = tVar4;
  pjVar3->iFlags = pjVar3->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_mktime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFunction;
	jx9_int64 iVal = 0;
	struct tm *pTm;
	time_t t;
	/* Extract function name */
	zFunction = jx9_function_name(pCtx);
	/* Get the current time */
	time(&t);
	if( zFunction[0] == 'g' /* gmmktime */ ){
		pTm = gmtime(&t);
	}else{
		/* localtime */
		pTm = localtime(&t);
	}
	if( nArg > 0 ){
		int iVal;
		/* Hour */
		iVal = jx9_value_to_int(apArg[0]);
		pTm->tm_hour = iVal;
		if( nArg > 1 ){
			/* Minutes */
			iVal = jx9_value_to_int(apArg[1]);
			pTm->tm_min = iVal;
			if( nArg > 2 ){
				/* Seconds */
				iVal = jx9_value_to_int(apArg[2]);
				pTm->tm_sec = iVal;
				if( nArg > 3 ){
					/* Month */
					iVal = jx9_value_to_int(apArg[3]);
					pTm->tm_mon = iVal - 1;
					if( nArg > 4 ){
						/* mday */
						iVal = jx9_value_to_int(apArg[4]);
						pTm->tm_mday = iVal;
						if( nArg > 5 ){
							/* Year */
							iVal = jx9_value_to_int(apArg[5]);
							if( iVal > 1900 ){
								iVal -= 1900;
							}
							pTm->tm_year = iVal;
							if( nArg > 6 ){
								/* is_dst */
								iVal = jx9_value_to_bool(apArg[6]);
								pTm->tm_isdst = iVal;
							}
						}
					}
				}
			}
		}
	}
	/* Make the time */
	iVal = (jx9_int64)mktime(pTm);
	/* Return the timesatmp as a 64bit integer */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}